

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

pair<__gnu_cxx::__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>,_bool>
 pdqsort_detail::
 partition_right_branchless<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,std::less<FractionalInteger>>
           (FractionalInteger *begin,FractionalInteger *end)

{
  double *pdVar1;
  char cVar2;
  undefined8 uVar3;
  double dVar4;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  _Var5;
  FractionalInteger *pFVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  uchar uVar10;
  size_t i;
  long lVar11;
  ulong uVar12;
  FractionalInteger *__a;
  ulong uVar13;
  ulong uVar14;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  _Var15;
  FractionalInteger *pFVar16;
  ulong uVar17;
  FractionalInteger *pFVar18;
  pair<__gnu_cxx::__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>,_bool>
  pVar19;
  long local_1b8;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_1b0;
  ulong local_1a8;
  FractionalInteger local_178;
  uchar offsets_r_storage [128];
  uchar offsets_l_storage [128];
  
  local_178.fractionality = begin->fractionality;
  uVar3 = *(undefined8 *)((long)&begin->score + 4);
  local_178.score._0_4_ =
       (undefined4)((ulong)*(undefined8 *)((long)&begin->row_ep_norm2 + 4) >> 0x20);
  local_178.score._4_4_ = (undefined4)uVar3;
  local_178.basisIndex = (HighsInt)((ulong)uVar3 >> 0x20);
  local_178.row_ep_norm2._0_4_ = SUB84(begin->row_ep_norm2,0);
  local_178.row_ep_norm2._4_4_ = (undefined4)((ulong)begin->row_ep_norm2 >> 0x20);
  local_178.row_ep.
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (begin->row_ep).
       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_178.row_ep.
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (begin->row_ep).
       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_178.row_ep.
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (begin->row_ep).
       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (begin->row_ep).
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (begin->row_ep).
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (begin->row_ep).
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar11 = 0x48;
  lVar7 = 0;
  dVar4 = (double)CONCAT44(local_178.score._4_4_,local_178.score._0_4_);
  do {
    pdVar1 = (double *)((long)&begin->fractionality + lVar11);
    lVar7 = lVar7 + -0x38;
    lVar11 = lVar11 + 0x38;
  } while (dVar4 < *pdVar1);
  __a = (FractionalInteger *)((long)begin - lVar7);
  if (lVar7 == -0x38) {
    do {
      if (end <= __a) break;
      pFVar16 = end + -1;
      end = end + -1;
    } while (pFVar16->score <= dVar4);
  }
  else {
    do {
      pFVar16 = end + -1;
      end = end + -1;
    } while (pFVar16->score <= dVar4);
  }
  pFVar16 = __a;
  if (__a < end) {
    std::swap<FractionalInteger>(__a,end);
    pFVar16 = __a + 1;
    uVar17 = 0;
    uVar13 = 0;
    local_1b8 = 0;
    local_1a8 = 0;
    _Var15._M_current = pFVar16;
    pFVar18 = end;
    local_1b0._M_current = end;
    while (uVar14 = 0, pFVar16 < pFVar18) {
      uVar8 = ((long)pFVar18 - (long)pFVar16) / 0x38;
      uVar9 = uVar8 >> (uVar13 == 0);
      if (uVar17 != 0) {
        uVar9 = uVar14;
      }
      uVar8 = uVar8 - uVar9;
      if (uVar13 != 0) {
        uVar8 = uVar14;
      }
      uVar12 = 0;
      if (uVar9 < 0x40) {
        for (; uVar9 != uVar12; uVar12 = uVar12 + 1) {
          offsets_l_storage[uVar17 + 0x38] = (uchar)uVar12;
          uVar17 = uVar17 + (pFVar16->score <
                             (double)CONCAT44(local_178.score._4_4_,local_178.score._0_4_) ||
                            pFVar16->score ==
                            (double)CONCAT44(local_178.score._4_4_,local_178.score._0_4_));
          pFVar16 = pFVar16 + 1;
        }
      }
      else {
        for (; uVar12 < 0x40; uVar12 = uVar12 + 8) {
          uVar10 = (uchar)uVar12;
          offsets_l_storage[uVar17 + 0x38] = uVar10;
          dVar4 = (double)CONCAT44(local_178.score._4_4_,local_178.score._0_4_);
          lVar11 = (pFVar16->score <= dVar4) + uVar17;
          offsets_l_storage[lVar11 + 0x38] = uVar10 + '\x01';
          lVar11 = (ulong)(pFVar16[1].score <= dVar4) + lVar11;
          offsets_l_storage[lVar11 + 0x38] = uVar10 + '\x02';
          lVar11 = (ulong)(pFVar16[2].score <= dVar4) + lVar11;
          offsets_l_storage[lVar11 + 0x38] = uVar10 + '\x03';
          lVar11 = (ulong)(pFVar16[3].score <= dVar4) + lVar11;
          offsets_l_storage[lVar11 + 0x38] = uVar10 + '\x04';
          lVar11 = (ulong)(pFVar16[4].score <= dVar4) + lVar11;
          offsets_l_storage[lVar11 + 0x38] = uVar10 + '\x05';
          lVar11 = (ulong)(pFVar16[5].score <= dVar4) + lVar11;
          offsets_l_storage[lVar11 + 0x38] = uVar10 + '\x06';
          lVar11 = (ulong)(pFVar16[6].score <= dVar4) + lVar11;
          offsets_l_storage[lVar11 + 0x38] = uVar10 + '\a';
          uVar17 = (ulong)(pFVar16[7].score <= dVar4) + lVar11;
          pFVar16 = pFVar16 + 8;
        }
      }
      if (uVar8 < 0x40) {
        uVar9 = 0;
        while (uVar8 != uVar9) {
          uVar9 = uVar9 + 1;
          offsets_r_storage[uVar13 + 0x38] = (uchar)uVar9;
          pFVar6 = pFVar18 + -1;
          pFVar18 = pFVar18 + -1;
          uVar13 = uVar13 + ((double)CONCAT44(local_178.score._4_4_,local_178.score._0_4_) <=
                             pFVar6->score &&
                            pFVar6->score !=
                            (double)CONCAT44(local_178.score._4_4_,local_178.score._0_4_));
        }
      }
      else {
        uVar9 = 0;
        while (uVar9 < 0x40) {
          cVar2 = (char)uVar9;
          offsets_r_storage[uVar13 + 0x38] = cVar2 + '\x01';
          dVar4 = (double)CONCAT44(local_178.score._4_4_,local_178.score._0_4_);
          lVar11 = (dVar4 < pFVar18[-1].score) + uVar13;
          offsets_r_storage[lVar11 + 0x38] = cVar2 + '\x02';
          lVar11 = (ulong)(dVar4 < pFVar18[-2].score) + lVar11;
          offsets_r_storage[lVar11 + 0x38] = cVar2 + '\x03';
          lVar11 = (ulong)(dVar4 < pFVar18[-3].score) + lVar11;
          offsets_r_storage[lVar11 + 0x38] = cVar2 + '\x04';
          lVar11 = (ulong)(dVar4 < pFVar18[-4].score) + lVar11;
          offsets_r_storage[lVar11 + 0x38] = cVar2 + '\x05';
          lVar11 = (ulong)(dVar4 < pFVar18[-5].score) + lVar11;
          offsets_r_storage[lVar11 + 0x38] = cVar2 + '\x06';
          lVar11 = (ulong)(dVar4 < pFVar18[-6].score) + lVar11;
          offsets_r_storage[lVar11 + 0x38] = cVar2 + '\a';
          lVar11 = (ulong)(dVar4 < pFVar18[-7].score) + lVar11;
          uVar9 = uVar9 + 8;
          offsets_r_storage[lVar11 + 0x38] = (uchar)uVar9;
          pFVar6 = pFVar18 + -8;
          pFVar18 = pFVar18 + -8;
          uVar13 = (ulong)(dVar4 < pFVar6->score) + lVar11;
        }
      }
      uVar9 = uVar17;
      if (uVar13 < uVar17) {
        uVar9 = uVar13;
      }
      lVar11 = local_1a8 + 0x38;
      local_1a8 = local_1a8 + uVar9;
      _Var5._M_current = _Var15._M_current;
      if (uVar17 <= uVar13) {
        local_1a8 = uVar14;
        _Var5._M_current = pFVar16;
      }
      swap_offsets<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>>
                (_Var15,local_1b0,offsets_l_storage + lVar11,offsets_r_storage + local_1b8 + 0x38,
                 uVar9,uVar17 == uVar13);
      uVar17 = uVar17 - uVar9;
      uVar13 = uVar13 - uVar9;
      _Var15._M_current = _Var5._M_current;
      local_1b8 = local_1b8 + uVar9;
      if (uVar13 == 0) {
        local_1b8 = 0;
        local_1b0._M_current = pFVar18;
      }
    }
    if (uVar17 != 0) {
      while (pFVar16 = pFVar18, uVar17 != 0) {
        std::swap<FractionalInteger>
                  (_Var15._M_current + offsets_l_storage[uVar17 + local_1a8 + 0x37],pFVar16 + -1);
        uVar17 = uVar17 - 1;
        pFVar18 = pFVar16 + -1;
      }
    }
    if (uVar13 != 0) {
      while (uVar13 != 0) {
        std::swap<FractionalInteger>
                  (local_1b0._M_current + -(ulong)offsets_r_storage[uVar13 + local_1b8 + 0x37],
                   pFVar16);
        pFVar16 = pFVar16 + 1;
        uVar13 = uVar13 - 1;
      }
    }
  }
  _Var15._M_current = pFVar16 + -1;
  FractionalInteger::operator=(begin,_Var15._M_current);
  FractionalInteger::operator=(_Var15._M_current,&local_178);
  std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~_Vector_base
            (&local_178.row_ep.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>);
  pVar19._8_8_ = CONCAT71((int7)((ulong)__a >> 8),end <= __a) & 0xffffffff;
  pVar19.first._M_current = _Var15._M_current;
  return pVar19;
}

Assistant:

inline std::pair<Iter, bool> partition_right_branchless(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;

        // Move pivot into local for speed.
        T pivot(PDQSORT_PREFER_MOVE(*begin));
        Iter first = begin;
        Iter last = end;

        // Find the first element greater than or equal than the pivot (the median of 3 guarantees
        // this exists).
        while (comp(*++first, pivot));

        // Find the first element strictly smaller than the pivot. We have to guard this search if
        // there was no element before *first.
        if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
        else                    while (                !comp(*--last, pivot));

        // If the first pair of elements that should be swapped to partition are the same element,
        // the passed in sequence already was correctly partitioned.
        bool already_partitioned = first >= last;
        if (!already_partitioned) {
            std::iter_swap(first, last);
            ++first;

            // The following branchless partitioning is derived from "BlockQuicksort: How Branch
            // Mispredictions don’t affect Quicksort" by Stefan Edelkamp and Armin Weiss, but
            // heavily micro-optimized.
            unsigned char offsets_l_storage[block_size + cacheline_size];
            unsigned char offsets_r_storage[block_size + cacheline_size];
            unsigned char* offsets_l = align_cacheline(offsets_l_storage);
            unsigned char* offsets_r = align_cacheline(offsets_r_storage);

            Iter offsets_l_base = first;
            Iter offsets_r_base = last;
            size_t num_l, num_r, start_l, start_r;
            num_l = num_r = start_l = start_r = 0;
            
            while (first < last) {
                // Fill up offset blocks with elements that are on the wrong side.
                // First we determine how much elements are considered for each offset block.
                size_t num_unknown = last - first;
                size_t left_split = num_l == 0 ? (num_r == 0 ? num_unknown / 2 : num_unknown) : 0;
                size_t right_split = num_r == 0 ? (num_unknown - left_split) : 0;

                // Fill the offset blocks.
                if (left_split >= block_size) {
                    for (size_t i = 0; i < block_size;) {
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                    }
                } else {
                    for (size_t i = 0; i < left_split;) {
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                    }
                }

                if (right_split >= block_size) {
                    for (size_t i = 0; i < block_size;) {
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                    }
                } else {
                    for (size_t i = 0; i < right_split;) {
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                    }
                }

                // Swap elements and update block sizes and first/last boundaries.
                size_t num = std::min(num_l, num_r);
                swap_offsets(offsets_l_base, offsets_r_base,
                             offsets_l + start_l, offsets_r + start_r,
                             num, num_l == num_r);
                num_l -= num; num_r -= num;
                start_l += num; start_r += num;

                if (num_l == 0) {
                    start_l = 0;
                    offsets_l_base = first;
                }
                
                if (num_r == 0) {
                    start_r = 0;
                    offsets_r_base = last;
                }
            }

            // We have now fully identified [first, last)'s proper position. Swap the last elements.
            if (num_l) {
                offsets_l += start_l;
                while (num_l--) std::iter_swap(offsets_l_base + offsets_l[num_l], --last);
                first = last;
            }
            if (num_r) {
                offsets_r += start_r;
                while (num_r--) std::iter_swap(offsets_r_base - offsets_r[num_r], first), ++first;
                last = first;
            }
        }

        // Put the pivot in the right place.
        Iter pivot_pos = first - 1;
        *begin = PDQSORT_PREFER_MOVE(*pivot_pos);
        *pivot_pos = PDQSORT_PREFER_MOVE(pivot);

        return std::make_pair(pivot_pos, already_partitioned);
    }